

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zello_log.h
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
to_string_abi_cxx11_(ze_device_cache_property_flag_t val)

{
  ulong uVar1;
  uint in_ESI;
  undefined4 in_register_0000003c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  allocator local_8b;
  byte local_8a;
  byte local_89;
  string local_88 [32];
  string local_68 [48];
  string local_38 [8];
  string str;
  uint32_t bits;
  ze_device_cache_property_flag_t val_local;
  
  this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         CONCAT44(in_register_0000003c,val);
  std::__cxx11::string::string(local_38);
  if (in_ESI == 0) {
    std::__cxx11::string::operator+=(local_38,"0 | ");
  }
  if ((in_ESI & 1) != 0) {
    std::__cxx11::string::operator+=(local_38,"CACHE_PROPERTY_FLAG_USER_CONTROL | ");
  }
  uVar1 = std::__cxx11::string::size();
  local_89 = 0;
  local_8a = 0;
  if (uVar1 < 4) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"Device::{ ? }",&local_8b);
    std::allocator<char>::~allocator((allocator<char> *)&local_8b);
  }
  else {
    std::__cxx11::string::size();
    std::__cxx11::string::substr((ulong)local_88,(ulong)local_38);
    local_89 = 1;
    std::operator+((char *)local_68,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"Device::{ "
                  );
    local_8a = 1;
    std::operator+(this,(char *)local_68);
  }
  if ((local_8a & 1) != 0) {
    std::__cxx11::string::~string(local_68);
  }
  if ((local_89 & 1) != 0) {
    std::__cxx11::string::~string(local_88);
  }
  std::__cxx11::string::~string(local_38);
  return this;
}

Assistant:

std::string to_string(const ze_device_cache_property_flag_t val )
{
    const auto bits = static_cast<uint32_t>( val );

    std::string str;

    if( 0 == bits )
        str += "0 | ";
    
    if( static_cast<uint32_t>(ZE_DEVICE_CACHE_PROPERTY_FLAG_USER_CONTROL) & bits )
        str += "CACHE_PROPERTY_FLAG_USER_CONTROL | ";

    return ( str.size() > 3 ) 
        ? "Device::{ " + str.substr(0, str.size() - 3) + " }"
        : "Device::{ ? }";
}